

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void fts5MultiIterNew(Fts5Index *p,Fts5Structure *pStruct,int flags,Fts5Colset *pColset,u8 *pTerm,
                     int nTerm,int iLevel,int nSegment,Fts5Iter **ppOut)

{
  int *pRc;
  int *piVar1;
  int iVar2;
  int iVar3;
  Fts5Hash *p_00;
  byte bVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Fts5Iter *pIter;
  code *pcVar8;
  Fts5Data *pFVar9;
  Fts5HashEntry *pData;
  u8 *pTerm_00;
  Fts5StructureSegment *pSeg;
  u32 nData;
  Fts5SegIter *pFVar10;
  Fts5StructureLevel *pFVar11;
  ulong uVar12;
  long lVar13;
  Fts5HashEntry *pFVar14;
  int local_90;
  int local_68;
  
  uVar12 = 0;
  if (p->rc == 0) {
    if (iLevel < 0) {
      uVar12 = (ulong)((uint)((flags & 0x40U) == 0 && p->pHash != (Fts5Hash *)0x0) +
                      pStruct->nSegment);
    }
    else {
      uVar5 = pStruct->aLevel[(uint)iLevel].nSeg;
      if ((int)uVar5 < nSegment) {
        nSegment = uVar5;
      }
      uVar12 = (ulong)(uint)nSegment;
    }
  }
  pIter = fts5MultiIterAlloc(p,(int)uVar12);
  *ppOut = pIter;
  if (pIter == (Fts5Iter *)0x0) {
    return;
  }
  pRc = &p->rc;
  pIter->bRev = (uint)flags >> 1 & 1;
  pIter->bSkipEmpty = (byte)flags >> 4 & 1;
  pIter->pColset = pColset;
  if ((flags & 0x20U) == 0) {
    fts5IterSetOutputCb(pRc,pIter);
  }
  if (*pRc != 0) goto LAB_001e4428;
  if (iLevel < 0) {
    iVar2 = pStruct->nLevel;
    p_00 = p->pHash;
    iVar6 = 0;
    if ((char)((flags & 0x40U) >> 6) == '\0' && p_00 != (Fts5Hash *)0x0) {
      if (pTerm == (u8 *)0x0) {
        pTerm_00 = (u8 *)0x0;
LAB_001e4140:
        iVar6 = sqlite3Fts5HashScanInit(p_00,(char *)pTerm_00,nTerm);
        p->rc = iVar6;
        pFVar14 = p->pHash->pScan;
        if (pFVar14 == (Fts5HashEntry *)0x0) {
          local_68 = 0;
          pData = (Fts5HashEntry *)0x0;
          nData = 0;
          pFVar9 = (Fts5Data *)0x0;
        }
        else {
          pData = pFVar14 + 1;
          nData = pFVar14->nKey;
          fts5HashAddPoslistSize(p->pHash,pFVar14,(Fts5HashEntry *)0x0);
          local_68 = (pFVar14->nData - nData) + -0x30;
          pFVar9 = (Fts5Data *)sqlite3Fts5MallocZero(pRc,0x10);
          if (pFVar9 == (Fts5Data *)0x0) {
            pFVar9 = (Fts5Data *)0x0;
          }
          else {
            pFVar9->p = (u8 *)((long)&pData->pHashNext + (long)(int)nData);
          }
        }
        p->bDelete = 0;
      }
      else {
        pTerm_00 = pTerm;
        if ((flags & 8U) != 0) goto LAB_001e4140;
        if (nTerm < 1) {
          uVar5 = 0xd;
        }
        else {
          uVar12 = (ulong)(uint)nTerm + 1;
          uVar5 = 0xd;
          do {
            uVar5 = uVar5 * 8 ^ uVar5 ^ (uint)pTerm[uVar12 - 2];
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        local_68 = 0;
        pFVar14 = p_00->aSlot[(ulong)uVar5 % (ulong)(uint)p_00->nSlot];
        iVar6 = 0;
        if (pFVar14 != (Fts5HashEntry *)0x0) {
          do {
            if ((pFVar14->nKey == nTerm) &&
               (iVar6 = bcmp(pFVar14 + 1,pTerm,(long)nTerm), iVar6 == 0)) {
              iVar3 = pFVar14->nData;
              iVar7 = sqlite3_initialize();
              iVar6 = 7;
              if (iVar7 != 0) goto LAB_001e4270;
              lVar13 = (long)iVar3 - (long)(nTerm + 0x30);
              pFVar9 = (Fts5Data *)sqlite3Malloc(lVar13 + 0x1a);
              if (pFVar9 == (Fts5Data *)0x0) goto LAB_001e4270;
              local_90 = (int)lVar13;
              memcpy(pFVar9 + 1,(void *)((long)&pFVar14->pHashNext + (long)(nTerm + 0x30)),
                     (long)local_90);
              local_68 = fts5HashAddPoslistSize
                                   (p_00,pFVar14,
                                    (Fts5HashEntry *)((long)&pFVar9->p + (long)(-0x20 - nTerm)));
              local_68 = local_90 + local_68;
              *pRc = 0;
              pFVar9->p = (u8 *)(pFVar9 + 1);
              goto LAB_001e427a;
            }
            pFVar14 = pFVar14->pHashNext;
          } while (pFVar14 != (Fts5HashEntry *)0x0);
          iVar6 = 0;
        }
LAB_001e4270:
        *pRc = iVar6;
        pFVar9 = (Fts5Data *)0x0;
LAB_001e427a:
        piVar1 = &pIter->aSeg[0].flags;
        *(byte *)piVar1 = (byte)*piVar1 | 1;
        pData = (Fts5HashEntry *)pTerm;
        nData = nTerm;
      }
      if (pFVar9 != (Fts5Data *)0x0) {
        pIter->aSeg[0].term.n = 0;
        sqlite3Fts5BufferAppendBlob(pRc,&pIter->aSeg[0].term,nData,(u8 *)pData);
        pFVar9->szLeaf = local_68;
        pFVar9->nn = local_68;
        pIter->aSeg[0].pLeaf = pFVar9;
        bVar4 = sqlite3Fts5GetVarint(pFVar9->p,(u64 *)&pIter->aSeg[0].iRowid);
        pIter->aSeg[0].iLeafOffset = (ulong)bVar4;
        pIter->aSeg[0].iEndofDoclist = pFVar9->nn;
        if ((flags & 2U) == 0) {
          fts5SegIterLoadNPos(p,pIter->aSeg);
        }
        else {
          piVar1 = &pIter->aSeg[0].flags;
          *(byte *)piVar1 = (byte)*piVar1 | 2;
          fts5SegIterReverseInitPage(p,pIter->aSeg);
        }
      }
      if ((pIter->aSeg[0].flags & 2) == 0) {
        if (p->pConfig->eDetail == 1) {
          pcVar8 = fts5SegIterNext_None;
        }
        else {
          pcVar8 = fts5SegIterNext;
        }
        pIter->aSeg[0].xNext = pcVar8;
        iVar6 = 1;
      }
      else {
        pIter->aSeg[0].xNext = fts5SegIterNext_Reverse;
        iVar6 = 1;
      }
    }
    if (0 < iVar2) {
      pFVar11 = pStruct->aLevel;
      do {
        lVar13 = (long)pFVar11->nSeg;
        if (0 < lVar13) {
          pFVar10 = pIter->aSeg + iVar6;
          uVar12 = lVar13 + 1;
          iVar6 = iVar6 + pFVar11->nSeg;
          lVar13 = lVar13 * 0x38;
          do {
            pSeg = (Fts5StructureSegment *)((long)&pFVar11->aSeg[-1].iSegid + lVar13);
            if (pTerm == (u8 *)0x0) {
              fts5SegIterInit(p,pSeg,pFVar10);
            }
            else {
              fts5SegIterSeekInit(p,pTerm,nTerm,flags,pSeg,pFVar10);
            }
            pFVar10 = pFVar10 + 1;
            uVar12 = uVar12 - 1;
            lVar13 = lVar13 + -0x38;
          } while (1 < uVar12);
        }
        pFVar11 = pFVar11 + 1;
      } while (pFVar11 < pStruct->aLevel + iVar2);
    }
  }
  else if (0 < (int)uVar12) {
    pFVar10 = pIter->aSeg;
    lVar13 = uVar12 * 0x38 + -0x38;
    do {
      fts5SegIterInit(p,(Fts5StructureSegment *)
                        ((long)&(pStruct->aLevel[(uint)iLevel].aSeg)->iSegid + lVar13),pFVar10);
      lVar13 = lVar13 + -0x38;
      pFVar10 = pFVar10 + 1;
    } while (lVar13 != -0x38);
  }
  if (*pRc == 0) {
    fts5MultiIterFinishSetup(p,pIter);
    return;
  }
LAB_001e4428:
  fts5MultiIterFree(pIter);
  *ppOut = (Fts5Iter *)0x0;
  return;
}

Assistant:

static void fts5MultiIterNew(
  Fts5Index *p,                   /* FTS5 backend to iterate within */
  Fts5Structure *pStruct,         /* Structure of specific index */
  int flags,                      /* FTS5INDEX_QUERY_XXX flags */
  Fts5Colset *pColset,            /* Colset to filter on (or NULL) */
  const u8 *pTerm, int nTerm,     /* Term to seek to (or NULL/0) */
  int iLevel,                     /* Level to iterate (-1 for all) */
  int nSegment,                   /* Number of segments to merge (iLevel>=0) */
  Fts5Iter **ppOut                /* New object */
){
  int nSeg = 0;                   /* Number of segment-iters in use */
  int iIter = 0;                  /* */
  int iSeg;                       /* Used to iterate through segments */
  Fts5StructureLevel *pLvl;
  Fts5Iter *pNew;

  assert( (pTerm==0 && nTerm==0) || iLevel<0 );

  /* Allocate space for the new multi-seg-iterator. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      assert( pStruct->nSegment==fts5StructureCountSegments(pStruct) );
      nSeg = pStruct->nSegment;
      nSeg += (p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH));
    }else{
      nSeg = MIN(pStruct->aLevel[iLevel].nSeg, nSegment);
    }
  }
  *ppOut = pNew = fts5MultiIterAlloc(p, nSeg);
  if( pNew==0 ){
    assert( p->rc!=SQLITE_OK );
    goto fts5MultiIterNew_post_check;
  }
  pNew->bRev = (0!=(flags & FTS5INDEX_QUERY_DESC));
  pNew->bSkipEmpty = (0!=(flags & FTS5INDEX_QUERY_SKIPEMPTY));
  pNew->pColset = pColset;
  if( (flags & FTS5INDEX_QUERY_NOOUTPUT)==0 ){
    fts5IterSetOutputCb(&p->rc, pNew);
  }

  /* Initialize each of the component segment iterators. */
  if( p->rc==SQLITE_OK ){
    if( iLevel<0 ){
      Fts5StructureLevel *pEnd = &pStruct->aLevel[pStruct->nLevel];
      if( p->pHash && 0==(flags & FTS5INDEX_QUERY_SKIPHASH) ){
        /* Add a segment iterator for the current contents of the hash table. */
        Fts5SegIter *pIter = &pNew->aSeg[iIter++];
        fts5SegIterHashInit(p, pTerm, nTerm, flags, pIter);
      }
      for(pLvl=&pStruct->aLevel[0]; pLvl<pEnd; pLvl++){
        for(iSeg=pLvl->nSeg-1; iSeg>=0; iSeg--){
          Fts5StructureSegment *pSeg = &pLvl->aSeg[iSeg];
          Fts5SegIter *pIter = &pNew->aSeg[iIter++];
          if( pTerm==0 ){
            fts5SegIterInit(p, pSeg, pIter);
          }else{
            fts5SegIterSeekInit(p, pTerm, nTerm, flags, pSeg, pIter);
          }
        }
      }
    }else{
      pLvl = &pStruct->aLevel[iLevel];
      for(iSeg=nSeg-1; iSeg>=0; iSeg--){
        fts5SegIterInit(p, &pLvl->aSeg[iSeg], &pNew->aSeg[iIter++]);
      }
    }
    assert( iIter==nSeg );
  }

  /* If the above was successful, each component iterator now points
  ** to the first entry in its segment. In this case initialize the
  ** aFirst[] array. Or, if an error has occurred, free the iterator
  ** object and set the output variable to NULL.  */
  if( p->rc==SQLITE_OK ){
    fts5MultiIterFinishSetup(p, pNew);
  }else{
    fts5MultiIterFree(pNew);
    *ppOut = 0;
  }

fts5MultiIterNew_post_check:
  assert( (*ppOut)!=0 || p->rc!=SQLITE_OK );
  return;
}